

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.c
# Opt level: O2

float calc_average_generic(pooling_calc_context_t calc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int kx;
  int iVar4;
  int jx;
  float fVar5;
  int in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  int in_stack_00000018;
  int in_stack_0000001c;
  int in_stack_00000020;
  int in_stack_00000024;
  int in_stack_00000028;
  int in_stack_0000002c;
  undefined8 in_stack_00000030;
  code *in_stack_00000038;
  int in_stack_00000050;
  char in_stack_00000058;
  float local_5c;
  int local_54;
  
  if (in_stack_0000002c == 3) {
    if (in_stack_00000058 == '\0') {
      in_stack_00000028 =
           (in_stack_0000001c - in_stack_00000018) *
           (in_stack_00000014 - in_stack_00000010) * (in_stack_0000000c - in_stack_00000008);
    }
    local_54 = in_stack_00000020 * in_stack_00000008 + in_stack_00000010 * in_stack_00000024 +
               in_stack_00000050 + in_stack_00000018;
    local_5c = 0.0;
    for (; iVar3 = in_stack_00000010, iVar1 = local_54, in_stack_00000008 < in_stack_0000000c;
        in_stack_00000008 = in_stack_00000008 + 1) {
      for (; iVar4 = in_stack_00000018, iVar2 = iVar1, iVar3 < in_stack_00000014; iVar3 = iVar3 + 1)
      {
        for (; iVar4 < in_stack_0000001c; iVar4 = iVar4 + 1) {
          fVar5 = (float)(*in_stack_00000038)(in_stack_00000030,iVar2);
          local_5c = local_5c + fVar5;
          iVar2 = iVar2 + 1;
        }
        iVar1 = iVar1 + in_stack_00000024;
      }
      local_54 = local_54 + in_stack_00000020;
    }
  }
  else {
    local_5c = 0.0;
    if (in_stack_0000002c == 2) {
      if (in_stack_00000058 == '\0') {
        in_stack_00000028 =
             (in_stack_00000014 - in_stack_00000010) * (in_stack_0000000c - in_stack_00000008);
      }
      for (; in_stack_00000008 < in_stack_0000000c; in_stack_00000008 = in_stack_00000008 + 1) {
        for (iVar3 = in_stack_00000020 * in_stack_00000008 + in_stack_00000010;
            iVar3 < in_stack_00000014 + in_stack_00000020 * in_stack_00000008; iVar3 = iVar3 + 1) {
          fVar5 = (float)(*in_stack_00000038)(in_stack_00000030,in_stack_00000050 + iVar3);
          local_5c = local_5c + fVar5;
        }
      }
    }
  }
  return local_5c / (float)in_stack_00000028;
}

Assistant:

float calc_average_generic(pooling_calc_context_t calc) {
  float val = 0.0f;
  float average_val = 0.0f;
  if (calc.kernel_size == 2) {
    if (!calc.including_pad) {
      calc.pool_size = (calc.hend - calc.hstart) * (calc.wend - calc.wstart);
    }
    for (int ix = calc.hstart; ix < calc.hend; ix++) {
      for (int jx = ix * calc.hstride + calc.wstart;
           jx < ix * calc.hstride + calc.wend; jx++) {
        val += calc.get_x(calc.x, jx + calc.offset_x);
      }
    }
  } else if (calc.kernel_size == 3) {
    if (!calc.including_pad) {
      calc.pool_size = (calc.hend - calc.hstart) * (calc.wend - calc.wstart) *
                       (calc.dend - calc.dstart);
    }
    for (int ix = calc.hstart; ix < calc.hend; ix++) {
      for (int jx = calc.wstart; jx < calc.wend; jx++) {
        for (int kx = calc.dstart; kx < calc.dend; kx++) {
          val += calc.get_x(calc.x, ix * calc.hstride + jx * calc.wstride + kx +
                                        calc.offset_x);
        }
      }
    }
  }
  average_val = val / calc.pool_size;
  return average_val;
}